

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

int sptk::world::anon_unknown_2::DetectOfficialF0CandidatesSub2
              (int *vuv,double **raw_f0_candidates,int index,int number_of_voiced_sections,int *st,
              int *ed,int max_candidates,double *f0_list)

{
  int i_1;
  int j;
  int i;
  double tmp_f0;
  int number_of_candidates;
  int *ed_local;
  int *st_local;
  int number_of_voiced_sections_local;
  int index_local;
  double **raw_f0_candidates_local;
  int *vuv_local;
  
  number_of_candidates = 0;
  for (i = 0; i < number_of_voiced_sections; i = i + 1) {
    if (9 < ed[i] - st[i]) {
      tmp_f0 = 0.0;
      for (j = st[i]; j < ed[i]; j = j + 1) {
        tmp_f0 = raw_f0_candidates[j][index] + tmp_f0;
      }
      f0_list[number_of_candidates] = tmp_f0 / (double)(ed[i] - st[i]);
      number_of_candidates = number_of_candidates + 1;
    }
  }
  for (i_1 = number_of_candidates; i_1 < max_candidates; i_1 = i_1 + 1) {
    f0_list[i_1] = 0.0;
  }
  return number_of_candidates;
}

Assistant:

static int DetectOfficialF0CandidatesSub2(const int *vuv,
    const double * const *raw_f0_candidates, int index,
    int number_of_voiced_sections, const int *st, const int *ed,
    int max_candidates, double *f0_list) {
  int number_of_candidates = 0;
  double tmp_f0;
  for (int i = 0; i < number_of_voiced_sections; ++i) {
    if (ed[i] - st[i] < 10) continue;

    tmp_f0 = 0.0;
    for (int j = st[i]; j < ed[i]; ++j)
      tmp_f0 += raw_f0_candidates[j][index];
    tmp_f0 /= (ed[i] - st[i]);
    f0_list[number_of_candidates++] = tmp_f0;
  }

  for (int i = number_of_candidates; i < max_candidates; ++i) f0_list[i] = 0.0;
  return number_of_candidates;
}